

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O0

Bit32s MT32Emu::calcTargetPitchOffsetWithoutLFO
                 (PartialParam *partialParam,int levelIndex,uint velocity)

{
  Bit32u BVar1;
  int targetPitchOffsetWithoutLFO;
  int veloMult;
  uint velocity_local;
  int levelIndex_local;
  PartialParam *partialParam_local;
  
  BVar1 = calcVeloMult((partialParam->pitchEnv).veloSensitivity,velocity);
  return (int)(((partialParam->pitchEnv).level[levelIndex] - 0x32) * BVar1) >>
         (0x10 - (partialParam->pitchEnv).depth & 0x1f);
}

Assistant:

static Bit32s calcTargetPitchOffsetWithoutLFO(const TimbreParam::PartialParam *partialParam, int levelIndex, unsigned int velocity) {
	int veloMult = calcVeloMult(partialParam->pitchEnv.veloSensitivity, velocity);
	int targetPitchOffsetWithoutLFO = partialParam->pitchEnv.level[levelIndex] - 50;
	targetPitchOffsetWithoutLFO = (targetPitchOffsetWithoutLFO * veloMult) >> (16 - partialParam->pitchEnv.depth); // PORTABILITY NOTE: Assumes arithmetic shift
	return targetPitchOffsetWithoutLFO;
}